

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeGlobalGet(TranslateToFuzzReader *this,Type type)

{
  Name name_00;
  bool bVar1;
  pointer ppVar2;
  value_type *pvVar3;
  bool local_81;
  __node_type *local_80;
  _Node_iterator_base<std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_true>
  local_78;
  undefined1 local_50 [8];
  value_type name;
  _Node_iterator_base<std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_true>
  local_38;
  _Node_iterator_base<std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_true>
  local_30;
  iterator it;
  unordered_map<wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
  *relevantGlobals;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  this_local = (TranslateToFuzzReader *)type.id;
  if (this->funcContext == (FunctionCreationContext *)0x0) {
    bVar1 = FeatureSet::hasGC(&this->wasm->features);
    if (bVar1) {
      local_80 = (__node_type *)&this->immutableGlobalsByType;
    }
    else {
      local_80 = (__node_type *)&this->importedImmutableGlobalsByType;
    }
    local_78._M_cur = local_80;
  }
  else {
    local_78._M_cur = (__node_type *)&this->globalsByType;
  }
  it.
  super__Node_iterator_base<std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_true>
             )(_Node_iterator_base<std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_true>
               )local_78._M_cur;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
       ::find(local_78._M_cur,(key_type *)&this_local);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
       ::end(it.
             super__Node_iterator_base<std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_true>
             ._M_cur);
  bVar1 = std::__detail::operator==(&local_30,&local_38);
  local_81 = true;
  if (!bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_false,_true>
                           *)&local_30);
    local_81 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::empty(&ppVar2->second);
  }
  if (local_81 == false) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_false,_true>
                           *)&local_30);
    pvVar3 = pick<std::vector<wasm::Name,std::allocator<wasm::Name>>>(this,&ppVar2->second);
    local_50 = (undefined1  [8])(pvVar3->super_IString).str._M_len;
    name.super_IString.str._M_len = (size_t)(pvVar3->super_IString).str._M_str;
    bVar1 = IString::operator!=((IString *)local_50,&(this->HANG_LIMIT_GLOBAL).super_IString);
    if (!bVar1) {
      __assert_fail("name != HANG_LIMIT_GLOBAL",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0xae0,"Expression *wasm::TranslateToFuzzReader::makeGlobalGet(Type)");
    }
    name_00.super_IString.str._M_str = (char *)name.super_IString.str._M_len;
    name_00.super_IString.str._M_len = (size_t)local_50;
    type_local.id = (uintptr_t)Builder::makeGlobalGet(&this->builder,name_00,(Type)this_local);
  }
  else {
    name.super_IString.str._M_str = (char *)this_local;
    type_local.id = (uintptr_t)makeConst(this,(Type)this_local);
  }
  return (Expression *)type_local.id;
}

Assistant:

Expression* TranslateToFuzzReader::makeGlobalGet(Type type) {
  // In a non-function context, like in another global, we can only get from an
  // immutable global. Whether GC is enabled also matters, as it allows getting
  // from a non-import.
  auto& relevantGlobals =
    funcContext ? globalsByType
                : (wasm.features.hasGC() ? immutableGlobalsByType
                                         : importedImmutableGlobalsByType);
  auto it = relevantGlobals.find(type);
  // If we have no such relevant globals give up and emit a constant instead.
  if (it == relevantGlobals.end() || it->second.empty()) {
    return makeConst(type);
  }

  auto name = pick(it->second);
  // We don't want random fuzz code to use the hang limit global.
  assert(name != HANG_LIMIT_GLOBAL);
  return builder.makeGlobalGet(name, type);
}